

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

shared_ptr<LNode> __thiscall LParser::reduce_25(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar1;
  shared_ptr<LNode> local_d0;
  shared_ptr<LNode> local_c0;
  shared_ptr<LNode> local_b0;
  LNodeF1Stmt local_a0;
  undefined4 local_6c;
  shared_ptr<LNodeData<LNodeF1Stmt>_> r;
  shared_ptr<LNode> stmts;
  undefined1 local_38 [8];
  shared_ptr<LNode> expr;
  shared_ptr<LNode> var;
  LParser *this_local;
  
  get_node((LParser *)&expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,in_ESI
          );
  get_node((LParser *)local_38,in_ESI);
  get_node((LParser *)
           &r.super___shared_ptr<LNodeData<LNodeF1Stmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
           in_ESI);
  local_6c = 0x2c;
  std::shared_ptr<LNode>::shared_ptr
            (&local_b0,
             (shared_ptr<LNode> *)
             &expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::shared_ptr(&local_c0,(shared_ptr<LNode> *)local_38);
  std::shared_ptr<LNode>::shared_ptr
            (&local_d0,
             (shared_ptr<LNode> *)
             &r.super___shared_ptr<LNodeData<LNodeF1Stmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  LNodeF1Stmt::LNodeF1Stmt(&local_a0,&local_b0,&local_c0,&local_d0);
  std::make_shared<LNodeData<LNodeF1Stmt>,LNodeType,LNodeF1Stmt>
            ((LNodeType *)&stack0xffffffffffffff98,(LNodeF1Stmt *)&stack0xffffffffffffff94);
  LNodeF1Stmt::~LNodeF1Stmt(&local_a0);
  std::shared_ptr<LNode>::~shared_ptr(&local_d0);
  std::shared_ptr<LNode>::~shared_ptr(&local_c0);
  std::shared_ptr<LNode>::~shared_ptr(&local_b0);
  std::shared_ptr<LNode>::shared_ptr<LNodeData<LNodeF1Stmt>,void>
            ((shared_ptr<LNode> *)this,
             (shared_ptr<LNodeData<LNodeF1Stmt>_> *)&stack0xffffffffffffff98);
  std::shared_ptr<LNodeData<LNodeF1Stmt>_>::~shared_ptr
            ((shared_ptr<LNodeData<LNodeF1Stmt>_> *)&stack0xffffffffffffff98);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &r.super___shared_ptr<LNodeData<LNodeF1Stmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::~shared_ptr((shared_ptr<LNode> *)local_38);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_25() {
    // F1Stmt : FOR Var IN Expr DO Brs Stmts END Brs
    auto var = this->get_node(8);
    auto expr = this->get_node(6);
    auto stmts = this->get_node(3);
    auto r = std::make_shared<LNodeData<LNodeF1Stmt>>(
            LNodeType::F1Stmt,
            LNodeF1Stmt(std::move(var), std::move(expr), std::move(stmts))
    );
    return r;
}